

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iraffits.c
# Opt level: O0

int iraf2mem(char *filename,char **buffptr,size_t *buffsize,size_t *filesize,int *status)

{
  char *__ptr;
  long *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  int *in_R8;
  int lenirafhead;
  char *irafheader;
  size_t *in_stack_00000170;
  size_t *in_stack_00000178;
  char **in_stack_00000180;
  int in_stack_0000018c;
  char *in_stack_00000190;
  char *in_stack_00000198;
  int *in_stack_000001a0;
  size_t *in_stack_000001a8;
  size_t *in_stack_000001b0;
  char **in_stack_000001b8;
  undefined4 local_4;
  
  *in_RSI = 0;
  *in_RDX = 0;
  *in_RCX = 0;
  __ptr = irafrdhead(filename,(int *)buffptr);
  if (__ptr == (char *)0x0) {
    *in_R8 = 0x68;
    local_4 = 0x68;
  }
  else {
    iraftofits(in_stack_00000198,in_stack_00000190,in_stack_0000018c,in_stack_00000180,
               in_stack_00000178,in_stack_00000170,(int *)in_stack_000001b0);
    free(__ptr);
    if (*in_R8 < 1) {
      *in_RCX = ((*in_RCX - 1U) / 0xb40 + 1) * 0xb40;
      irafrdimage(in_stack_000001b8,in_stack_000001b0,in_stack_000001a8,in_stack_000001a0);
      local_4 = *in_R8;
    }
    else {
      local_4 = *in_R8;
    }
  }
  return local_4;
}

Assistant:

int iraf2mem(char *filename,     /* name of input file                 */
             char **buffptr,     /* O - memory pointer (initially NULL)    */
             size_t *buffsize,   /* O - size of mem buffer, in bytes        */
             size_t *filesize,   /* O - size of FITS file, in bytes         */
             int *status)        /* IO - error status                       */

/*
   Driver routine that reads an IRAF image into memory, also converting
   it into FITS format.
*/
{
    char *irafheader;
    int lenirafhead;

    *buffptr = NULL;
    *buffsize = 0;
    *filesize = 0;

    /* read IRAF header into dynamically created char array (free it later!) */
    irafheader = irafrdhead(filename, &lenirafhead);

    if (!irafheader)
    {
	return(*status = FILE_NOT_OPENED);
    }

    /* convert IRAF header to FITS header in memory */
    iraftofits(filename, irafheader, lenirafhead, buffptr, buffsize, filesize,
               status);

    /* don't need the IRAF header any more */
    free(irafheader);

    if (*status > 0)
       return(*status);

    *filesize = (((*filesize - 1) / 2880 ) + 1 ) * 2880; /* multiple of 2880 */

    /* append the image data onto the FITS header */
    irafrdimage(buffptr, buffsize, filesize, status);

    return(*status);
}